

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::
CmpHelperEQ<mp::SolverOptionManager::option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption*>>,mp::SolverOptionManager::option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption*>>>
          (char *expected_expression,char *actual_expression,
          option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption_*>_> *expected,
          option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption_*>_> *actual)

{
  bool bVar1;
  char *in_RCX;
  option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption_*>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption_*>_> *in_RSI;
  undefined8 in_RDI;
  string *in_R8;
  AssertionResult AVar3;
  option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption_*>_> *in_stack_ffffffffffffff58
  ;
  option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption_*>_> in_stack_ffffffffffffff60;
  string local_70 [32];
  string local_50 [31];
  undefined1 in_stack_ffffffffffffffcf;
  string *actual_value;
  option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption_*>_> *expected_expression_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  actual_value = *(string **)in_R8;
  bVar1 = mp::SolverOptionManager::
          option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption_*>_>::operator==
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    expected_expression_00 = in_RDX;
    FormatForComparisonFailureMessage<mp::SolverOptionManager::option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption*>>,mp::SolverOptionManager::option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption*>>>
              (in_RDX,in_RSI);
    FormatForComparisonFailureMessage<mp::SolverOptionManager::option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption*>>,mp::SolverOptionManager::option_iterator_base<std::_Rb_tree_const_iterator<mp::SolverOption*>>>
              (in_RDX,in_RSI);
    EqFailure((char *)expected_expression_00,in_RCX,in_R8,actual_value,
              (bool)in_stack_ffffffffffffffcf);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = in_RDI;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}